

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O1

void Eigen::internal::
     triangular_solver_selector<const_Eigen::Matrix<float,_-1,_-1,_0,_4,_4>,_Eigen::Matrix<float,_-1,_-1,_0,_4,_4>,_1,_5,_0,_-1>
     ::run(Matrix<float,__1,__1,_0,_4,_4> *lhs,Matrix<float,__1,__1,_0,_4,_4> *rhs)

{
  long size;
  BlockingType blocking;
  level3_blocking<float,_float> local_1b8;
  LhsScalar local_188 [16];
  RhsScalar local_148 [16];
  RhsScalar local_108 [66];
  
  size = (lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>).m_storage.m_rows;
  local_1b8.m_blockA = local_188;
  local_1b8.m_mc = 4;
  local_1b8.m_nc = 4;
  local_1b8.m_kc = 4;
  local_1b8.m_blockB = local_148;
  local_1b8.m_blockW = local_108;
  triangular_solve_matrix<float,_long,_1,_5,_false,_0,_0>::run
            (size,(rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>).m_storage.
                  m_cols,(float *)lhs,size,(float *)rhs,
             (rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>).m_storage.m_rows,
             &local_1b8);
  return;
}

Assistant:

static void run(const Lhs& lhs, Rhs& rhs)
  {
    typename internal::add_const_on_value_type<ActualLhsType>::type actualLhs = LhsProductTraits::extract(lhs);

    const Index size = lhs.rows();
    const Index othersize = Side==OnTheLeft? rhs.cols() : rhs.rows();

    typedef internal::gemm_blocking_space<(Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Rhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxRowsAtCompileTime,4> BlockingType;

    BlockingType blocking(rhs.rows(), rhs.cols(), size);

    triangular_solve_matrix<Scalar,Index,Side,Mode,LhsProductTraits::NeedToConjugate,(int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor,
                               (Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor>
      ::run(size, othersize, &actualLhs.coeffRef(0,0), actualLhs.outerStride(), &rhs.coeffRef(0,0), rhs.outerStride(), blocking);
  }